

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void print_decl_spec(c2m_ctx_t c2m_ctx,FILE *f,decl_spec *decl_spec)

{
  byte bVar1;
  char *pcVar2;
  
  bVar1 = *(byte *)decl_spec;
  if ((bVar1 & 1) != 0) {
    fwrite(" typedef, ",10,1,(FILE *)f);
    bVar1 = *(byte *)decl_spec;
  }
  if ((bVar1 & 2) != 0) {
    fwrite(" extern, ",9,1,(FILE *)f);
    bVar1 = *(byte *)decl_spec;
  }
  if ((bVar1 & 4) != 0) {
    fwrite(" static, ",9,1,(FILE *)f);
    bVar1 = *(byte *)decl_spec;
  }
  if ((bVar1 & 8) != 0) {
    fwrite(" auto, ",7,1,(FILE *)f);
    bVar1 = *(byte *)decl_spec;
  }
  if ((bVar1 & 0x10) != 0) {
    fwrite(" register, ",0xb,1,(FILE *)f);
    bVar1 = *(byte *)decl_spec;
  }
  if ((bVar1 & 0x20) != 0) {
    fwrite(" thread local, ",0xf,1,(FILE *)f);
    bVar1 = *(byte *)decl_spec;
  }
  if ((bVar1 & 0x40) != 0) {
    fwrite(" inline, ",9,1,(FILE *)f);
    bVar1 = *(byte *)decl_spec;
  }
  if ((char)bVar1 < '\0') {
    fwrite(" no return, ",0xc,1,(FILE *)f);
  }
  if (-1 < decl_spec->align) {
    fprintf((FILE *)f," align = %d, ");
  }
  if (decl_spec->align_node != (node_t_conflict)0x0) {
    fprintf((FILE *)f," strictest align node %u, ",(ulong)decl_spec->align_node->uid);
  }
  if (decl_spec->linkage != N_IGNORE) {
    pcVar2 = "extern";
    if (decl_spec->linkage == N_STATIC) {
      pcVar2 = "static";
    }
    fprintf((FILE *)f," %s linkage, ",pcVar2);
  }
  print_type(c2m_ctx,f,decl_spec->type);
  return;
}

Assistant:

static void print_decl_spec (c2m_ctx_t c2m_ctx, FILE *f, struct decl_spec *decl_spec) {
  if (decl_spec->typedef_p) fprintf (f, " typedef, ");
  if (decl_spec->extern_p) fprintf (f, " extern, ");
  if (decl_spec->static_p) fprintf (f, " static, ");
  if (decl_spec->auto_p) fprintf (f, " auto, ");
  if (decl_spec->register_p) fprintf (f, " register, ");
  if (decl_spec->thread_local_p) fprintf (f, " thread local, ");
  if (decl_spec->inline_p) fprintf (f, " inline, ");
  if (decl_spec->no_return_p) fprintf (f, " no return, ");
  if (decl_spec->align >= 0) fprintf (f, " align = %d, ", decl_spec->align);
  if (decl_spec->align_node != NULL)
    fprintf (f, " strictest align node %u, ", decl_spec->align_node->uid);
  if (decl_spec->linkage != N_IGNORE)
    fprintf (f, " %s linkage, ", decl_spec->linkage == N_STATIC ? "static" : "extern");
  print_type (c2m_ctx, f, decl_spec->type);
}